

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall Parser::checkMacroDefinition(Parser *this)

{
  char *__s1;
  TokenizerPosition start;
  pointer pCVar1;
  pointer pFVar2;
  bool bVar3;
  int iVar4;
  Token *pTVar5;
  Token *pTVar6;
  iterator iVar7;
  mapped_type *this_00;
  TokenizerPosition pos;
  iterator iVar8;
  bool bVar9;
  long lVar10;
  ulong uVar11;
  Identifier name;
  vector<Expression,_std::allocator<Expression>_> parameters;
  Identifier local_108;
  vector<Expression,_std::allocator<Expression>_> local_e8;
  ParserMacro local_d0;
  vector<Token,_std::allocator<Token>_> local_48;
  
  pTVar5 = Tokenizer::peekToken
                     ((this->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar5->type != Identifier) {
    return false;
  }
  if (*(__index_type *)
       ((long)&(pTVar5->value).
               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
       + 0x20) != '\x04') {
LAB_00146906:
    __assert_fail("std::holds_alternative<Identifier>(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                  ,0x4d,"const Identifier &Token::identifierValue() const");
  }
  __s1 = *(char **)&(pTVar5->value).
                    super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                    super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .
                    super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .
                    super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    ._M_u;
  if (((*__s1 != '.') ||
      (*(long *)((long)&(pTVar5->value).
                        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                + 8) != 6)) || (iVar4 = bcmp(__s1,".macro",6), iVar4 != 0)) {
    return false;
  }
  Tokenizer::eatTokens
            ((this->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer,1);
  if (this->initializingMacro == true) {
    printError<>(this,pTVar5,"Nested macro definitions not allowed");
    iVar8._M_node =
         (_List_node_base *)
         (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
    if ((_List_node_base *)((TokenizerPosition *)((long)(iVar8._M_node + 1) + 8))->it ==
        iVar8._M_node) {
      return true;
    }
    do {
      pTVar5 = Tokenizer::nextToken((Tokenizer *)iVar8._M_node);
      if (pTVar5->type == Identifier) {
        if (*(__index_type *)
             ((long)&(pTVar5->value).
                     super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                     super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
             + 0x20) != '\x04') goto LAB_00146906;
        if ((*(long *)((long)&(pTVar5->value).
                              super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      + 8) == 9) &&
           (iVar4 = bcmp(*(void **)&(pTVar5->value).
                                    super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    ._M_u,".endmacro",9), iVar4 == 0)) {
          return true;
        }
      }
      iVar8._M_node =
           (_List_node_base *)
           (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
      if ((_List_node_base *)((TokenizerPosition *)((long)(iVar8._M_node + 1) + 8))->it ==
          iVar8._M_node) {
        return true;
      }
    } while( true );
  }
  local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (Expression *)0x0;
  local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = parseExpressionList(this,&local_e8,1,-1);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_00146804;
  }
  local_d0.name._name._M_dataplus._M_p = (pointer)&local_d0.name._name.field_2;
  local_d0.name._name._M_string_length = 0;
  local_d0.name._name.field_2._M_local_buf[0] = '\0';
  local_d0.parameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.parameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.parameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_d0.counter = 0;
  local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = Expression::evaluateIdentifier
                    (local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_d0.name);
  if (bVar3) {
    if (1 < (ulong)(((long)local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      uVar11 = 1;
      lVar10 = 0x18;
      do {
        local_108._name._M_dataplus._M_p = (pointer)&local_108._name.field_2;
        local_108._name._M_string_length = 0;
        local_108._name.field_2._M_allocated_capacity =
             local_108._name.field_2._M_allocated_capacity & 0xffffffffffffff00;
        bVar3 = Expression::evaluateIdentifier
                          ((Expression *)
                           ((long)&((local_e8.
                                     super__Vector_base<Expression,_std::allocator<Expression>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->expression).
                                   super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar10),&local_108);
        if (!bVar3) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._name._M_dataplus._M_p != &local_108._name.field_2) {
            operator_delete(local_108._name._M_dataplus._M_p,
                            local_108._name.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001467c3;
        }
        std::vector<Identifier,_std::allocator<Identifier>_>::push_back
                  (&local_d0.parameters,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._name._M_dataplus._M_p != &local_108._name.field_2) {
          operator_delete(local_108._name._M_dataplus._M_p,
                          local_108._name.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) goto LAB_001467c3;
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x18;
      } while (uVar11 < (ulong)(((long)local_e8.
                                       super__Vector_base<Expression,_std::allocator<Expression>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_e8.
                                       super__Vector_base<Expression,_std::allocator<Expression>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    pTVar6 = Tokenizer::nextToken
                       ((this->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    if (pTVar6->type != Separator) {
      printError<>(this,pTVar5,"Macro directive not terminated");
      goto LAB_001467c3;
    }
    start.it._M_node =
         (iterator)
         (((this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
    bVar9 = false;
    do {
      iVar8._M_node =
           (_List_node_base *)
           (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
      if ((_List_node_base *)((TokenizerPosition *)((long)(iVar8._M_node + 1) + 8))->it ==
          iVar8._M_node) break;
      pTVar6 = Tokenizer::nextToken((Tokenizer *)iVar8._M_node);
      if (pTVar6->type == Identifier) {
        if (*(__index_type *)
             ((long)&(pTVar6->value).
                     super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                     super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
             + 0x20) != '\x04') goto LAB_00146906;
        if ((*(long *)((long)&(pTVar6->value).
                              super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      + 8) != 9) ||
           (iVar4 = bcmp(*(void **)&(pTVar6->value).
                                    super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    .
                                    super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                    ._M_u,".endmacro",9), iVar4 != 0)) goto LAB_00146721;
        bVar9 = true;
        bVar3 = false;
      }
      else {
LAB_00146721:
        bVar3 = true;
      }
    } while (bVar3);
    pCVar1 = (this->conditionStack).
             super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pCVar1[-1].inUnknownBlock == true) {
      printError<>(this,pTVar5,
                   "Macro definition not allowed inside of block with non-trivial condition");
      goto LAB_001467c3;
    }
    bVar3 = true;
    if (pCVar1[-1].inTrueBlock == true) {
      iVar7 = std::
              _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
              ::find(&(this->macros)._M_t,&local_d0.name);
      if ((_Rb_tree_header *)iVar7._M_node != &(this->macros)._M_t._M_impl.super__Rb_tree_header) {
        printError<Identifier>(this,pTVar5,"Macro \"%s\" already defined",&local_d0.name);
        goto LAB_001467c3;
      }
      if (bVar9) {
        pFVar2 = (this->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        Tokenizer::getTokens
                  (&local_48,pFVar2[-1].tokenizer,start,
                   (TokenizerPosition)(((pFVar2[-1].tokenizer)->position).it._M_node)->_M_prev);
        local_108._name.field_2._M_allocated_capacity =
             (size_type)
             local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_108._name._M_string_length =
             (size_type)
             local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_108._name._M_dataplus._M_p =
             (pointer)local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<Token,_std::allocator<Token>_>::~vector
                  ((vector<Token,_std::allocator<Token>_> *)&local_108);
        std::vector<Token,_std::allocator<Token>_>::~vector(&local_48);
        pTVar6 = Tokenizer::nextToken
                           ((this->entries).
                            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
        if (pTVar6->type != Separator) {
          printError<>(this,pTVar5,"Endmacro directive not terminated");
          goto LAB_001467c3;
        }
        this_00 = std::
                  map<Identifier,_ParserMacro,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
                  ::operator[](&this->macros,&local_d0.name);
        ParserMacro::operator=(this_00,&local_d0);
      }
      else {
        printError<Identifier>(this,pTVar5,"Macro \"%s\" not terminated",&local_d0.name);
      }
    }
  }
  else {
LAB_001467c3:
    bVar3 = false;
  }
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_d0.content);
  std::
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  ::~_Rb_tree(&local_d0.labels._M_t);
  std::vector<Identifier,_std::allocator<Identifier>_>::~vector(&local_d0.parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._name._M_dataplus._M_p != &local_d0.name._name.field_2) {
    operator_delete(local_d0.name._name._M_dataplus._M_p,
                    CONCAT71(local_d0.name._name.field_2._M_allocated_capacity._1_7_,
                             local_d0.name._name.field_2._M_local_buf[0]) + 1);
  }
LAB_00146804:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&local_e8);
  return bVar3;
}

Assistant:

bool Parser::checkMacroDefinition()
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	const auto &identifier = first.identifierValue();
	if (!identifier.startsWith('.') || first.identifierValue() != ".macro")
		return false;

	eatToken();

	// nested macro definitions are not allowed
	if (initializingMacro)
	{
		printError(first, "Nested macro definitions not allowed");
		while (!atEnd())
		{
			const Token& token = nextToken();
			if (token.type == TokenType::Identifier && token.identifierValue() == ".endmacro")
				break;
		}

		return true;
	}

	std::vector<Expression> parameters;
	if (!parseExpressionList(parameters,1,-1))
		return false;

	ParserMacro macro;
	macro.counter = 0;

	// load name
	if (!parameters[0].evaluateIdentifier(macro.name))
		return false;

	// load parameters
	for (size_t i = 1; i < parameters.size(); i++)
	{
		Identifier name;
		if (!parameters[i].evaluateIdentifier(name))
			return false;

		macro.parameters.push_back(name);
	}

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, "Macro directive not terminated");
		return false;
	}

	// load macro content

	TokenizerPosition start = getTokenizer()->getPosition();
	bool valid = false;
	while (!atEnd())
	{
		const Token& tok = nextToken();
		if (tok.type == TokenType::Identifier && tok.identifierValue() == ".endmacro")
		{
			valid = true;
			break;
		}
	}

	// Macros have to be defined at parse time, so they can't be defined in blocks
	// with non-trivial conditions
	if (isInsideUnknownBlock())
	{
		printError(first, "Macro definition not allowed inside of block with non-trivial condition");
		return false;
	}

	// if we are in a known false block, don't define the macro
	if (!isInsideTrueBlock())
		return true;
	
	// duplicate check
	if (macros.find(macro.name) != macros.end())
	{
		printError(first, "Macro \"%s\" already defined", macro.name);
		return false;
	}

	// no .endmacro, not valid
	if (!valid)
	{
		printError(first, "Macro \"%s\" not terminated", macro.name);
		return true;
	}

	// get content
	TokenizerPosition end = getTokenizer()->getPosition().previous();
	macro.content = getTokenizer()->getTokens(start,end);

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, "Endmacro directive not terminated");
		return false;
	}

	macros[macro.name] = macro;
	return true;
}